

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==(NeuralNetworkClassifier *a,NeuralNetworkClassifier *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  bVar3 = operator==(&a->layers_,&b->layers_);
  if ((bVar3) && (bVar3 = operator==(&a->preprocessing_,&b->preprocessing_), bVar3)) {
    uVar1 = a->_oneof_case_[0];
    uVar2 = b->_oneof_case_[0];
    if (uVar1 == uVar2) {
      if (uVar1 == 0) {
        return true;
      }
      if (uVar1 != 100) {
        puVar4 = _Int64Vector_default_instance_;
        puVar5 = _Int64Vector_default_instance_;
        if (uVar1 == 0x65) {
          puVar5 = (undefined1 *)(a->ClassLabels_).int64classlabels_;
        }
        if (uVar2 == 0x65) {
          puVar4 = (undefined1 *)(b->ClassLabels_).int64classlabels_;
        }
        bVar3 = vectorsEqual<CoreML::Specification::Int64Vector>
                          ((Int64Vector *)puVar5,(Int64Vector *)puVar4);
        return bVar3;
      }
      puVar4 = _StringVector_default_instance_;
      puVar5 = _StringVector_default_instance_;
      if (uVar1 == 100) {
        puVar5 = (undefined1 *)(a->ClassLabels_).stringclasslabels_;
      }
      if (uVar2 == 100) {
        puVar4 = (undefined1 *)(b->ClassLabels_).stringclasslabels_;
      }
      bVar3 = vectorsEqual<CoreML::Specification::StringVector>
                        ((StringVector *)puVar5,(StringVector *)puVar4);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool operator==(const NeuralNetworkClassifier& a,
                        const NeuralNetworkClassifier& b) {
            if (a.layers() != b.layers()) {
                return false;
            }
            if (a.preprocessing() != b.preprocessing()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case NeuralNetworkClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case NeuralNetworkClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case NeuralNetworkClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }